

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

Clump * rw::Clump::create(void)

{
  Clump *object;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp line: 30"
  ;
  object = (Clump *)(*Engine::memfuncs)((long)s_plglist,0x30010);
  if (object == (Clump *)0x0) {
    create();
  }
  else {
    numAllocated = numAllocated + 1;
    (object->object).type = '\x02';
    (object->object).subType = '\0';
    (object->object).flags = '\0';
    (object->object).privateFlags = '\0';
    (object->object).parent = (void *)0x0;
    (object->atomics).link.next = &(object->atomics).link;
    (object->atomics).link.prev = &(object->atomics).link;
    (object->lights).link.next = &(object->lights).link;
    (object->lights).link.prev = &(object->lights).link;
    (object->cameras).link.next = &(object->cameras).link;
    (object->cameras).link.prev = &(object->cameras).link;
    object->world = (World *)0x0;
    (object->inWorld).next = (LLLink *)0x0;
    (object->inWorld).prev = (LLLink *)0x0;
    PluginList::construct((PluginList *)&s_plglist,object);
  }
  return object;
}

Assistant:

Clump*
Clump::create(void)
{
	Clump *clump = (Clump*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_CLUMP);
	if(clump == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	clump->object.init(Clump::ID, 0);
	clump->atomics.init();
	clump->lights.init();
	clump->cameras.init();

	// World extension
	clump->world = nil;
	clump->inWorld.init();

	s_plglist.construct(clump);
	return clump;
}